

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

shared_ptr<Pipeline> __thiscall
anon_unknown.dwarf_246090::ImageOptimizer::makePipeline
          (ImageOptimizer *this,string *description,Pipeline *next)

{
  QPDFJob *pQVar1;
  bool bVar2;
  ulong uVar3;
  longlong lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  double dVar6;
  shared_ptr<Pipeline> sVar7;
  shared_ptr<Pl_DCT> local_218;
  anon_class_8_1_aac66e5c local_208;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_200;
  anon_class_8_1_aac66e5c local_1e0;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1d8;
  undefined4 local_1b8;
  J_COLOR_SPACE local_1b4;
  J_COLOR_SPACE cs;
  int components;
  string colorspace;
  JDIMENSION h;
  JDIMENSION w;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_180;
  allocator<char> local_159;
  string local_158 [32];
  undefined1 local_138 [8];
  QPDFObjectHandle components_obj;
  anon_class_8_1_aac66e5c local_120;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_118;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  QPDFObjectHandle colorspace_obj;
  string local_b8 [32];
  undefined1 local_98 [8];
  QPDFObjectHandle h_obj;
  string local_80 [32];
  undefined1 local_60 [8];
  QPDFObjectHandle w_obj;
  undefined1 local_40 [8];
  QPDFObjectHandle dict;
  uint local_28 [2];
  Pipeline *next_local;
  string *description_local;
  ImageOptimizer *this_local;
  shared_ptr<Pipeline> *result;
  
  dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  next_local = next;
  description_local = description;
  this_local = this;
  std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)this);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"/Width",
             (allocator<char> *)
             ((long)&h_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_60,(string *)local_40);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&h_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"/Height",
             (allocator<char> *)
             ((long)&colorspace_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_98,(string *)local_40);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&colorspace_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"/ColorSpace",&local_f1);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d0,(string *)local_40);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  bVar2 = QPDFObjectHandle::isNumber((QPDFObjectHandle *)local_60);
  if ((!bVar2) || (bVar2 = QPDFObjectHandle::isNumber((QPDFObjectHandle *)local_98), !bVar2)) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pQVar1 = (QPDFJob *)(description->field_2)._M_allocated_capacity;
      local_120.description = (string *)next_local;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<(anonymous_namespace)::ImageOptimizer::makePipeline(std::__cxx11::string_const&,Pipeline*)::__0,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_118,&local_120);
      QPDFJob::doIfVerbose(pQVar1,&local_118);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_118);
    }
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._7_1_ = 1;
    components_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    goto LAB_00208d02;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"/BitsPerComponent",&local_159);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_138,(string *)local_40);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_138);
  if ((bVar2) && (lVar4 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_138), lVar4 == 8))
  {
    colorspace.field_2._12_4_ = 0;
    bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_60);
    if (bVar2) {
      colorspace.field_2._12_4_ = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)local_60)
      ;
    }
    else {
      dVar6 = QPDFObjectHandle::getNumericValue((QPDFObjectHandle *)local_60);
      colorspace.field_2._12_4_ = (undefined4)(long)dVar6;
    }
    colorspace.field_2._8_4_ = 0;
    bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_98);
    if (bVar2) {
      colorspace.field_2._8_4_ = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)local_98);
    }
    else {
      dVar6 = QPDFObjectHandle::getNumericValue((QPDFObjectHandle *)local_98);
      colorspace.field_2._8_4_ = (undefined4)(long)dVar6;
    }
    bVar2 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_d0);
    if (bVar2) {
      QPDFObjectHandle::getName_abi_cxx11_((string *)&cs,(QPDFObjectHandle *)local_d0);
    }
    else {
      std::__cxx11::string::string((string *)&cs);
    }
    local_1b4 = JCS_UNKNOWN;
    local_1b8 = 0;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs
                            ,"/DeviceRGB");
    if (bVar2) {
      local_1b4 = JCS_YCbCr;
      local_1b8 = 2;
LAB_00208b10:
      if ((((*(long *)((long)&description->field_2 + 8) == 0) ||
           (*(ulong *)((long)&description->field_2 + 8) < (ulong)(uint)colorspace.field_2._12_4_))
          && ((*(long *)(description + 1) == 0 ||
              (*(ulong *)(description + 1) < (ulong)(uint)colorspace.field_2._8_4_)))) &&
         ((description[1]._M_string_length == 0 ||
          (description[1]._M_string_length <
           (ulong)(uint)(colorspace.field_2._12_4_ * colorspace.field_2._8_4_))))) {
        std::__shared_ptr<Pl_DCT::CompressConfig,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<Pl_DCT::CompressConfig,_(__gnu_cxx::_Lock_policy)2> *)
                   &description[2]._M_string_length);
        std::
        make_shared<Pl_DCT,char_const(&)[4],Pipeline*&,unsigned_int&,unsigned_int&,int&,J_COLOR_SPACE&,Pl_DCT::CompressConfig*>
                  ((char (*) [4])&local_218,(Pipeline **)"jpg",local_28,
                   (uint *)(colorspace.field_2._M_local_buf + 0xc),
                   (int *)(colorspace.field_2._M_local_buf + 8),&local_1b4,
                   (CompressConfig **)&local_1b8);
        std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)this,&local_218);
        std::shared_ptr<Pl_DCT>::~shared_ptr(&local_218);
      }
      else {
        QTC::TC("qpdf","QPDFJob image optimize too small",0);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          pQVar1 = (QPDFJob *)(description->field_2)._M_allocated_capacity;
          local_208.description = (string *)next_local;
          std::function<void(Pipeline&,std::__cxx11::string_const&)>::
          function<(anonymous_namespace)::ImageOptimizer::makePipeline(std::__cxx11::string_const&,Pipeline*)::__3,void>
                    ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_200,&local_208)
          ;
          QPDFJob::doIfVerbose(pQVar1,&local_200);
          std::
          function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_200);
        }
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cs,"/DeviceGray");
      if (bVar2) {
        local_1b4 = JCS_GRAYSCALE;
        local_1b8 = 1;
        goto LAB_00208b10;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cs,"/DeviceCMYK");
      if (bVar2) {
        local_1b4 = JCS_CMYK;
        local_1b8 = 4;
        goto LAB_00208b10;
      }
      QTC::TC("qpdf","QPDFJob image optimize colorspace",0);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        pQVar1 = (QPDFJob *)(description->field_2)._M_allocated_capacity;
        local_1e0.description = (string *)next_local;
        std::function<void(Pipeline&,std::__cxx11::string_const&)>::
        function<(anonymous_namespace)::ImageOptimizer::makePipeline(std::__cxx11::string_const&,Pipeline*)::__2,void>
                  ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_1d8,&local_1e0);
        QPDFJob::doIfVerbose(pQVar1,&local_1d8);
        std::
        function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_1d8);
      }
    }
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._7_1_ = 1;
    components_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    std::__cxx11::string::~string((string *)&cs);
  }
  else {
    QTC::TC("qpdf","QPDFJob image optimize bits per component",0);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pQVar1 = (QPDFJob *)(description->field_2)._M_allocated_capacity;
      _h = (string *)next_local;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<(anonymous_namespace)::ImageOptimizer::makePipeline(std::__cxx11::string_const&,Pipeline*)::__1,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_180,
                 (anon_class_8_1_aac66e5c *)&h);
      QPDFJob::doIfVerbose(pQVar1,&local_180);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_180);
    }
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi._7_1_ = 1;
    components_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_138);
LAB_00208d02:
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_98);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  _Var5._M_pi = extraout_RDX;
  if ((dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)this);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar7.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar7.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
ImageOptimizer::makePipeline(std::string const& description, Pipeline* next)
{
    std::shared_ptr<Pipeline> result;
    QPDFObjectHandle dict = image.getDict();
    QPDFObjectHandle w_obj = dict.getKey("/Width");
    QPDFObjectHandle h_obj = dict.getKey("/Height");
    QPDFObjectHandle colorspace_obj = dict.getKey("/ColorSpace");
    if (!(w_obj.isNumber() && h_obj.isNumber())) {
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image dictionary is missing required keys\n";
            });
        }
        return result;
    }
    QPDFObjectHandle components_obj = dict.getKey("/BitsPerComponent");
    if (!(components_obj.isInteger() && (components_obj.getIntValue() == 8))) {
        QTC::TC("qpdf", "QPDFJob image optimize bits per component");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image has other than 8 bits per component\n";
            });
        }
        return result;
    }
    // Files have been seen in the wild whose width and height are floating point, which is goofy,
    // but we can deal with it.
    JDIMENSION w = 0;
    if (w_obj.isInteger()) {
        w = w_obj.getUIntValueAsUInt();
    } else {
        w = static_cast<JDIMENSION>(w_obj.getNumericValue());
    }
    JDIMENSION h = 0;
    if (h_obj.isInteger()) {
        h = h_obj.getUIntValueAsUInt();
    } else {
        h = static_cast<JDIMENSION>(h_obj.getNumericValue());
    }
    std::string colorspace = (colorspace_obj.isName() ? colorspace_obj.getName() : std::string());
    int components = 0;
    J_COLOR_SPACE cs = JCS_UNKNOWN;
    if (colorspace == "/DeviceRGB") {
        components = 3;
        cs = JCS_RGB;
    } else if (colorspace == "/DeviceGray") {
        components = 1;
        cs = JCS_GRAYSCALE;
    } else if (colorspace == "/DeviceCMYK") {
        components = 4;
        cs = JCS_CMYK;
    } else {
        QTC::TC("qpdf", "QPDFJob image optimize colorspace");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because qpdf can't optimize images with this colorspace\n";
            });
        }
        return result;
    }
    if (((this->oi_min_width > 0) && (w <= this->oi_min_width)) ||
        ((this->oi_min_height > 0) && (h <= this->oi_min_height)) ||
        ((this->oi_min_area > 0) && ((w * h) <= this->oi_min_area))) {
        QTC::TC("qpdf", "QPDFJob image optimize too small");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image is smaller than requested minimum "
                     "dimensions\n";
            });
        }
        return result;
    }

    result = std::make_shared<Pl_DCT>("jpg", next, w, h, components, cs, config.get());
    return result;
}